

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::
PrintAsHexLower<absl::lts_20250127::uint128>(IntDigits *this,uint128 v)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  
  uVar7 = v.lo_;
  pcVar3 = &this->field_0x3d;
  uVar4 = v.hi_;
  do {
    do {
      pcVar2 = pcVar3;
      uVar5 = uVar7 & 0xff;
      uVar7 = uVar7 >> 8 | uVar4 << 0x38;
      *(undefined2 *)(pcVar2 + -3) = *(undefined2 *)(numbers_internal::kHexTable + uVar5 * 2);
      uVar5 = uVar4 >> 8;
      pcVar3 = pcVar2 + -2;
      bVar1 = 0xff < uVar4;
      uVar4 = uVar5;
    } while (bVar1);
  } while (uVar7 != 0);
  pcVar6 = pcVar2 + -3;
  if (pcVar2[-3] == '0') {
    pcVar6 = pcVar3;
  }
  this->start_ = pcVar6;
  this->size_ = (long)this + (0x3c - (long)pcVar6);
  return;
}

Assistant:

void PrintAsHexLower(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);

    do {
      p -= 2;
      constexpr const char* table = numbers_internal::kHexTable;
      std::memcpy(p, table + 2 * (static_cast<size_t>(v) & 0xFF), 2);
      if (sizeof(T) == 1) break;
      v >>= 8;
    } while (v);
    if (p[0] == '0') {
      // We printed one too many digits.
      ++p;
    }
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }